

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O1

int Test_SUNMatMatvec(SUNMatrix A,N_Vector x,N_Vector y,int myid)

{
  int iVar1;
  uint uVar2;
  SUNMatrix A_00;
  N_Vector y_00;
  N_Vector y_01;
  char *__format;
  
  if (A->ops->matvec == (_func_SUNErrCode_SUNMatrix_N_Vector_N_Vector *)0x0) {
    if (print_all_ranks == 0 && myid == 0) {
      puts("    PASSED test -- SUNMatMatvec not implemented");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)(uint)myid);
      puts("    PASSED test -- SUNMatMatvec not implemented");
      return 0;
    }
    return 0;
  }
  iVar1 = is_square(A);
  if (iVar1 != 0) {
    A_00 = (SUNMatrix)SUNMatClone(A);
    uVar2 = SUNMatCopy(A,A_00);
    if (uVar2 == 0) {
      uVar2 = SUNMatScaleAddI(0x4008000000000000,A_00);
      if (uVar2 == 0) {
        y_00 = (N_Vector)N_VClone(y);
        y_01 = (N_Vector)N_VClone(y);
        if ((A_00->ops->matvecsetup == (_func_SUNErrCode_SUNMatrix *)0x0) ||
           (uVar2 = SUNMatMatvecSetup(A_00), uVar2 == 0)) {
          uVar2 = SUNMatMatvec(A_00,x,y_00);
          sync_device(A_00);
          if (uVar2 == 0) {
            N_VLinearSum(0x4008000000000000,0x3ff0000000000000,y,x,y_01);
            iVar1 = check_vector(y_01,y_00,2.220446049250313e-14);
            SUNMatDestroy(A_00);
            N_VDestroy(y_00);
            goto LAB_00104d4e;
          }
          if (print_all_ranks != 0 || myid != 0) {
            if (print_all_ranks == 0) goto LAB_00104d14;
            printf("process %06d: ",(ulong)(uint)myid);
          }
          __format = ">>> FAILED test -- SUNMatMatvec returned %d \n";
        }
        else {
          if (print_all_ranks != 0 || myid != 0) {
            if (print_all_ranks == 0) goto LAB_00104d14;
            printf("process %06d: ",(ulong)(uint)myid);
          }
          __format = ">>> FAILED test -- SUNMatMatvecSetup returned %d \n";
        }
      }
      else {
        if (print_all_ranks != 0 || myid != 0) {
          if (print_all_ranks == 0) goto LAB_00104d14;
          printf("process %06d: ",(ulong)(uint)myid);
        }
        __format = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
      }
    }
    else {
      if (print_all_ranks != 0 || myid != 0) {
        if (print_all_ranks == 0) goto LAB_00104d14;
        printf("process %06d: ",(ulong)(uint)myid);
      }
      __format = ">>> FAILED test -- SUNMatCopy returned %d \n";
    }
    printf(__format,(ulong)uVar2);
LAB_00104d14:
    SUNMatDestroy(A_00);
    return 1;
  }
  y_01 = (N_Vector)N_VClone(y);
  uVar2 = SUNMatMatvec(A,x,y_01);
  sync_device(A);
  if (uVar2 != 0) {
    if (print_all_ranks == 0 && myid == 0) {
      printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar2);
      return 1;
    }
    if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)(uint)myid);
      printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar2);
      return 1;
    }
    return 1;
  }
  iVar1 = check_vector(y,y_01,2.220446049250313e-14);
LAB_00104d4e:
  N_VDestroy(y_01);
  if (iVar1 == 0) {
    if (print_all_ranks == 0 && myid == 0) {
LAB_00104e2d:
      puts("    PASSED test -- SUNMatMatvec ");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)(uint)myid);
      goto LAB_00104e2d;
    }
    iVar1 = 0;
    if (myid != 0) {
      return 0;
    }
    goto LAB_00104e3f;
  }
  if (print_all_ranks == 0 && myid == 0) {
LAB_00104d7e:
    puts(">>> FAILED test -- SUNMatMatvec check ");
  }
  else if (print_all_ranks != 0) {
    printf("process %06d: ",(ulong)(uint)myid);
    goto LAB_00104d7e;
  }
  iVar1 = 1;
LAB_00104e3f:
  if (print_time != 0) {
    printf("    SUNMatMatvec Time: %22.15e \n \n",0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int Test_SUNMatMatvec(SUNMatrix A, N_Vector x, N_Vector y, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  N_Vector z, w;
  sunrealtype tol = 100 * SUN_UNIT_ROUNDOFF;

  if (A->ops->matvec == NULL)
  {
    TEST_STATUS("    PASSED test -- SUNMatMatvec not implemented\n", myid);
    return (0);
  }

  /* harder tests for square matrices */
  if (is_square(A))
  {
    /* protect A */
    B       = SUNMatClone(A);
    failure = SUNMatCopy(A, B);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
      SUNMatDestroy(B);
      return (1);
    }

    /* compute matrix vector product */
    failure = SUNMatScaleAddI(THREE, B);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      return (1);
    }

    z = N_VClone(y); /* will be computed with matvec */
    w = N_VClone(y); /* will be the reference */

    /* Call the Setup function before the Matvec if it exists */
    if (B->ops->matvecsetup)
    {
      failure = SUNMatMatvecSetup(B);
      if (failure)
      {
        TEST_STATUS2(">>> FAILED test -- SUNMatMatvecSetup returned %d \n",
                     failure, myid);
        SUNMatDestroy(B);
        return (1);
      }
    }

    start_time = get_time();
    failure    = SUNMatMatvec(B, x, z); /* z = (3A+I)x = 3y + x */
    sync_device(B);
    stop_time = get_time();

    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatMatvec returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      return (1);
    }

    N_VLinearSum(THREE, y, ONE, x, w); /* w = 3y + x */

    failure = check_vector(w, z, tol);

    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
  }
  else
  {
    z = N_VClone(y); /* will be computed with matvec */

    start_time = get_time();
    failure    = SUNMatMatvec(A, x, z); /* z = Ax */
    sync_device(A);
    stop_time = get_time();

    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatMatvec returned %d \n", failure,
                   myid);
      return (1);
    }

    failure = check_vector(y, z, tol);

    N_VDestroy(z);
  }

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatMatvec check \n", myid);
    PRINT_TIME("    SUNMatMatvec Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatMatvec \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatMatvec Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}